

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

bool __thiscall cmCTestHG::LoadModifications(cmCTestHG *this)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string hg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_status;
  OutputLogger err;
  StatusParser out;
  string local_330;
  long *local_310;
  long local_308;
  long local_300 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  OutputLogger local_2d8;
  undefined1 local_298 [32];
  long *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [36];
  char *local_30;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_310 = local_300;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,local_310,local_308 + (long)local_310);
  plVar3 = (long *)(local_270[0]._M_local_buf + 8);
  local_278 = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"status","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_298;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2f0,__l,(allocator_type *)&local_2d8);
  lVar2 = -0x40;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  StatusParser::StatusParser((StatusParser *)local_298,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_2d8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"status-err> ");
  local_330._M_string_length = 0;
  local_330.field_2._M_local_buf[0] = '\0';
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_2f0,(OutputParser *)local_298,
                      (OutputParser *)&local_2d8,&local_330,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,
                    CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                             local_330.field_2._M_local_buf[0]) + 1);
  }
  local_2d8.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b1b468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.super_LineParser.Line._M_dataplus._M_p !=
      &local_2d8.super_LineParser.Line.field_2) {
    operator_delete(local_2d8.super_LineParser.Line._M_dataplus._M_p,
                    local_2d8.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_298._0_8_ = &PTR__StatusParser_00b17e18;
  if (local_30 != (char *)0x0) {
    operator_delete__(local_30);
  }
  local_298._0_8_ = &PTR__LineParser_00b1b468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._24_8_ != local_270) {
    operator_delete((void *)local_298._24_8_,local_270[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f0);
  if (local_310 != local_300) {
    operator_delete(local_310,local_300[0] + 1);
  }
  return true;
}

Assistant:

bool cmCTestHG::LoadModifications()
{
  // Use 'hg status' to get modified files.
  std::string hg = this->CommandLineTool;
  std::vector<std::string> hg_status = { hg, "status" };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(hg_status, &out, &err);
  return true;
}